

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayLength(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IndirOpnd *pIVar5;
  ArrayRegOpnd *this_00;
  StackSym *pSVar6;
  StackSym *pSVar7;
  RegOpnd *opnd;
  Instr *pIVar8;
  Instr *this_01;
  RegOpnd *pRVar9;
  undefined7 in_register_00000011;
  Opnd *this_02;
  LowererMD *this_03;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseInvalidatedLengthOpnd;
  AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  bool bStack_38;
  undefined4 uStack_34;
  ValueType baseValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3494,"(instr)","instr");
    if (!bVar3) goto LAB_0056f828;
    *puVar4 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3495,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_0056f828;
    *puVar4 = 0;
  }
  this_02 = instr->m_dst;
  if (this_02 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3496,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_0056f828;
    *puVar4 = 0;
    this_02 = instr->m_dst;
  }
  bVar3 = IR::Opnd::IsIndirOpnd(this_02);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3497,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_0056f828;
    *puVar4 = 0;
  }
  _bStack_38 = (LabelInstr *)CONCAT44(uStack_34,(int)CONCAT71(in_register_00000011,isInHelperBlock))
  ;
  func = instr->m_func;
  pIVar5 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  pRVar9 = pIVar5->m_baseOpnd;
  local_3a = (pRVar9->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsNotArray((ValueType *)&local_3a.field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x349d,"(!baseValueType.IsNotArray())","!baseValueType.IsNotArray()");
    if (!bVar3) {
LAB_0056f828:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = IR::RegOpnd::IsArrayRegOpnd(pRVar9);
  if (bVar3) {
    this_00 = IR::RegOpnd::AsArrayRegOpnd(pRVar9);
    autoReuseInvalidatedLengthOpnd.autoDelete = false;
    autoReuseInvalidatedLengthOpnd.wasInUse = false;
    autoReuseInvalidatedLengthOpnd._18_6_ = 0;
    if (this_00 != (ArrayRegOpnd *)0x0) {
      pSVar6 = IR::ArrayRegOpnd::LengthSym(this_00);
      if (pSVar6 != (StackSym *)0x0) {
        pSVar6 = IR::ArrayRegOpnd::LengthSym(this_00);
        if (pSVar6 != this_00->headSegmentLengthSym) {
          pSVar6 = IR::ArrayRegOpnd::LengthSym(this_00);
          pSVar7 = IR::ArrayRegOpnd::LengthSym(this_00);
          opnd = IR::RegOpnd::New(pSVar6,pSVar7->m_type,func);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete,&opnd->super_Opnd,
                     func,true);
          goto LAB_0056f742;
        }
      }
    }
  }
  else {
    autoReuseInvalidatedLengthOpnd.autoDelete = false;
    autoReuseInvalidatedLengthOpnd.wasInUse = false;
    autoReuseInvalidatedLengthOpnd._18_6_ = 0;
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar9->super_Opnd);
  pIVar8 = IR::Instr::New(Call,func);
  opnd = IR::RegOpnd::New(TyUint32,func);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete,&opnd->super_Opnd,func,true
            );
  IR::Instr::SetDst(pIVar8,&opnd->super_Opnd);
  IR::Instr::InsertBefore(instr,pIVar8);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,pIVar8,HelperArray_Jit_GetArrayLength,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
LAB_0056f742:
  _bStack_38 = IR::Instr::GetOrCreateContinueLabel(instr,bStack_38);
  LowerOneBailOutKind(this,instr,BailOutOnInvalidatedArrayLength,false,false);
  pIVar8 = instr->m_next;
  this_03 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_03,pIVar8,&pRVar9->super_Opnd);
  LowererMD::LoadHelperArgument(this_03,pIVar8,&opnd->super_Opnd);
  this_01 = IR::Instr::New(Call,func);
  pRVar9 = IR::RegOpnd::New(TyUint8,func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_80,&pRVar9->super_Opnd,func,true);
  IR::Instr::SetDst(this_01,&pRVar9->super_Opnd);
  IR::Instr::InsertBefore(pIVar8,this_01);
  LowererMD::ChangeToHelperCall
            (this_03,this_01,HelperArray_Jit_OperationInvalidatedArrayLength,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTestBranch(&pRVar9->super_Opnd,&pRVar9->super_Opnd,BrEq_A,_bStack_38,pIVar8);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayLength(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the length changed during the helper call

        if(!(arrayOpnd && arrayOpnd.LengthSym() && arrayOpnd.LengthSym() != arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array length before the helper call
            lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different length after the helper call, then this store needs to bail out
        invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
        test invalidatedLength, invalidatedLength
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayLength)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArray());
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *lengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
    if(arrayOpnd && arrayOpnd->LengthSym() && arrayOpnd->LengthSym() != arrayOpnd->HeadSegmentLengthSym())
    {
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->LengthSym(), arrayOpnd->LengthSym()->GetType(), func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array length before the helper call
        //     lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(TyUint32, func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
        callInstr->SetDst(lengthBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayLength);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayLength, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different length after the helper call, then this store needs to bail out
    //     invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, lengthBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedLengthOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedLengthOpnd(invalidatedLengthOpnd, func);
    callInstr->SetDst(invalidatedLengthOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayLength);

    //     test invalidatedLength, invalidatedLength
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedLengthOpnd,
        invalidatedLengthOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayLength)
    //     $skipBailOut:
}